

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::EnumGenerator::Generate(EnumGenerator *this,Printer *printer)

{
  bool bVar1;
  Context *context;
  EnumDescriptor *pEVar2;
  pointer ppEVar3;
  EnumValueDescriptor *pEVar4;
  string *value1;
  Descriptor *descriptor;
  EnumGenerator *this_00;
  bool bVar5;
  mapped_type *pmVar6;
  long lVar7;
  ulong uVar8;
  long *plVar9;
  int i_00;
  int i_01;
  undefined8 extraout_RDX;
  undefined8 uVar10;
  undefined8 extraout_RDX_00;
  int i_2;
  char *pcVar11;
  ulong uVar12;
  int i_1;
  Printer *pPVar13;
  int i;
  long lVar14;
  allocator local_d1;
  Printer *local_d0;
  EnumGenerator *local_c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_90;
  key_type local_70;
  string index_text;
  
  WriteEnumDocComment(printer,this->descriptor_);
  context = this->context_;
  pEVar2 = this->descriptor_;
  bVar1 = this->immutable_api_;
  std::__cxx11::string::string((string *)&vars,"",(allocator *)&index_text);
  MaybePrintGeneratedAnnotation<google::protobuf::EnumDescriptor_const>
            (context,printer,pEVar2,bVar1,(string *)&vars);
  std::__cxx11::string::~string((string *)&vars);
  io::Printer::Print(printer,
                     "public enum $classname$\n    implements com.google.protobuf.ProtocolMessageEnum {\n"
                     ,"classname",*(string **)this->descriptor_);
  io::Printer::Annotate<google::protobuf::EnumDescriptor>(printer,"classname",this->descriptor_);
  io::Printer::Indent(printer);
  std::__cxx11::string::string((string *)&index_text,"ordinal()",(allocator *)&vars);
  ppEVar3 = (this->canonical_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(this->canonical_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3;
  uVar12 = 0xffffffffffffffff;
  do {
    local_d0 = printer;
    if (uVar12 - uVar8 == -1) {
      bVar1 = true;
      goto LAB_002a7c38;
    }
    pEVar4 = ppEVar3[uVar12 + 1];
    uVar12 = uVar12 + 1;
  } while (uVar12 == (((long)pEVar4 - *(long *)(*(long *)(pEVar4 + 0x18) + 0x30)) / 0x28 &
                     0xffffffffU));
  bVar1 = uVar8 <= uVar12;
  std::__cxx11::string::assign((char *)&index_text);
LAB_002a7c38:
  local_c8 = (EnumGenerator *)0x375ba1;
  if (bVar1) {
    local_c8 = (EnumGenerator *)0x375b8e;
  }
  for (uVar12 = 0; pPVar13 = local_d0,
      uVar12 < (ulong)((long)(this->canonical_values_).
                             super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->canonical_values_).
                             super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar12 = uVar12 + 1) {
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vars._M_t._M_impl.super__Rb_tree_header._M_header;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string((string *)&local_90,"name",(allocator *)&local_70);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&vars._M_t,&local_90);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&local_90);
    pEVar4 = (this->canonical_values_).
             super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar12];
    lVar7 = (long)pEVar4 - *(long *)(*(long *)(pEVar4 + 0x18) + 0x30);
    SimpleItoa_abi_cxx11_(&local_90,(protobuf *)(lVar7 / 0x28 & 0xffffffff),(int)(lVar7 % 0x28));
    std::__cxx11::string::string((string *)&local_70,"index",&local_d1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&vars._M_t,&local_70);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    SimpleItoa_abi_cxx11_
              (&local_90,
               (protobuf *)
               (ulong)*(uint *)((this->canonical_values_).
                                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar12] + 0x10),i_00);
    std::__cxx11::string::string((string *)&local_70,"number",&local_d1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&vars._M_t,&local_70);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    WriteEnumValueDocComment
              (local_d0,(this->canonical_values_).
                        super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar12]);
    if (*(char *)(*(long *)((this->canonical_values_).
                            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar12] + 0x20) + 0x68) ==
        '\x01') {
      io::Printer::Print(local_d0,"@java.lang.Deprecated\n");
    }
    io::Printer::Print(local_d0,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&vars._M_t,(char *)local_c8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&vars._M_t);
  }
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3) {
    pcVar11 = "UNRECOGNIZED(-1, -1),\n";
    if (bVar1) {
      pcVar11 = "UNRECOGNIZED(-1),\n";
    }
    io::Printer::Print(local_d0,pcVar11);
  }
  io::Printer::Print(pPVar13,";\n\n");
  lVar7 = 0;
  for (uVar12 = 0;
      uVar12 < (ulong)((long)(this->aliases_).
                             super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->aliases_).
                             super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4); uVar12 = uVar12 + 1) {
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vars._M_t._M_impl.super__Rb_tree_header._M_header;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string((string *)&local_90,"classname",(allocator *)&local_70);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&vars._M_t,&local_90);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_90,"name",(allocator *)&local_70);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&vars._M_t,&local_90);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_90,"canonical_name",(allocator *)&local_70);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&vars._M_t,&local_90);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&local_90);
    pPVar13 = local_d0;
    WriteEnumValueDocComment
              (local_d0,*(EnumValueDescriptor **)
                         ((long)&((this->aliases_).
                                  super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->value + lVar7));
    io::Printer::Print(pPVar13,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&vars._M_t,
                       "public static final $classname$ $name$ = $canonical_name$;\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&vars._M_t);
    lVar7 = lVar7 + 0x10;
  }
  lVar7 = 0;
  local_c8 = this;
  for (lVar14 = 0; pPVar13 = local_d0, lVar14 < *(int *)(local_c8->descriptor_ + 0x2c);
      lVar14 = lVar14 + 1) {
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vars._M_t._M_impl.super__Rb_tree_header._M_header;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::string((string *)&local_90,"name",(allocator *)&local_70);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&vars._M_t,&local_90);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&local_90);
    SimpleItoa_abi_cxx11_
              (&local_90,
               (protobuf *)(ulong)*(uint *)(*(long *)(local_c8->descriptor_ + 0x30) + 0x10 + lVar7),
               i_01);
    std::__cxx11::string::string((string *)&local_70,"number",&local_d1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&vars._M_t,&local_70);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pPVar13 = local_d0;
    WriteEnumValueDocComment
              (local_d0,(EnumValueDescriptor *)(*(long *)(local_c8->descriptor_ + 0x30) + lVar7));
    io::Printer::Print(pPVar13,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&vars._M_t,"public static final int $name$_VALUE = $number$;\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&vars._M_t);
    lVar7 = lVar7 + 0x28;
  }
  io::Printer::Print(local_d0,"\n");
  this_00 = local_c8;
  io::Printer::Print(pPVar13,"\npublic final int getNumber() {\n");
  if (*(int *)(*(long *)(this_00->descriptor_ + 0x10) + 0x8c) == 3) {
    pcVar11 = 
    "  if (index == -1) {\n    throw new java.lang.IllegalArgumentException(\n        \"Can\'t get the number of an unknown enum value.\");\n  }\n"
    ;
    if (bVar1) {
      pcVar11 = 
      "  if (this == UNRECOGNIZED) {\n    throw new java.lang.IllegalArgumentException(\n        \"Can\'t get the number of an unknown enum value.\");\n  }\n"
      ;
    }
    io::Printer::Print(pPVar13,pcVar11);
  }
  io::Printer::Print(pPVar13,
                     "  return value;\n}\n\n/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $classname$ valueOf(int value) {\n  return forNumber(value);\n}\n\npublic static $classname$ forNumber(int value) {\n  switch (value) {\n"
                     ,"classname",*(string **)this_00->descriptor_);
  io::Printer::Indent(pPVar13);
  io::Printer::Indent(pPVar13);
  uVar10 = extraout_RDX;
  for (uVar12 = 0; pPVar13 = local_d0,
      ppEVar3 = (this_00->canonical_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar12 < (ulong)((long)(this_00->canonical_values_).
                             super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3);
      uVar12 = uVar12 + 1) {
    pEVar4 = ppEVar3[uVar12];
    value1 = *(string **)pEVar4;
    SimpleItoa_abi_cxx11_((string *)&vars,(protobuf *)(ulong)*(uint *)(pEVar4 + 0x10),(int)uVar10);
    io::Printer::Print(local_d0,"case $number$: return $name$;\n","name",value1,"number",
                       (string *)&vars);
    std::__cxx11::string::~string((string *)&vars);
    uVar10 = extraout_RDX_00;
  }
  io::Printer::Outdent(local_d0);
  io::Printer::Outdent(pPVar13);
  io::Printer::Print(pPVar13,
                     "    default: return null;\n  }\n}\n\npublic static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n    internalGetValueMap() {\n  return internalValueMap;\n}\nprivate static final com.google.protobuf.Internal.EnumLiteMap<\n    $classname$> internalValueMap =\n      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n        public $classname$ findValueByNumber(int number) {\n          return $classname$.forNumber(number);\n        }\n      };\n\n"
                     ,"classname",*(string **)this_00->descriptor_);
  if (((this_00->context_->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(*(long *)(this_00->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
    io::Printer::Print(pPVar13,
                       "public final com.google.protobuf.Descriptors.EnumValueDescriptor\n    getValueDescriptor() {\n  return getDescriptor().getValues().get($index_text$);\n}\npublic final com.google.protobuf.Descriptors.EnumDescriptor\n    getDescriptorForType() {\n  return getDescriptor();\n}\npublic static final com.google.protobuf.Descriptors.EnumDescriptor\n    getDescriptor() {\n"
                       ,"index_text",&index_text);
    descriptor = *(Descriptor **)(this_00->descriptor_ + 0x18);
    if (descriptor == (Descriptor *)0x0) {
      ClassNameResolver::GetClassName_abi_cxx11_
                ((string *)&vars,this_00->name_resolver_,
                 *(FileDescriptor **)(this_00->descriptor_ + 0x10),this_00->immutable_api_);
      pEVar2 = this_00->descriptor_;
      plVar9 = (long *)(*(long *)(pEVar2 + 0x10) + 0x70);
      if (*(long *)(pEVar2 + 0x18) != 0) {
        plVar9 = (long *)(*(long *)(pEVar2 + 0x18) + 0x60);
      }
      SimpleItoa_abi_cxx11_
                (&local_90,(protobuf *)(((long)pEVar2 - *plVar9) / 0x38 & 0xffffffff),
                 (int)(((long)pEVar2 - *plVar9) % 0x38));
      io::Printer::Print(pPVar13,"  return $file$.getDescriptor().getEnumTypes().get($index$);\n",
                         "file",(string *)&vars,"index",&local_90);
    }
    else {
      ClassNameResolver::GetClassName_abi_cxx11_
                ((string *)&vars,this_00->name_resolver_,descriptor,this_00->immutable_api_);
      pcVar11 = "getDescriptor()";
      if (*(char *)(*(long *)(*(long *)(this_00->descriptor_ + 0x18) + 0x20) + 0x69) != '\0') {
        pcVar11 = "getDefaultInstance().getDescriptorForType()";
      }
      std::__cxx11::string::string((string *)&local_90,pcVar11,&local_d1);
      pEVar2 = this_00->descriptor_;
      plVar9 = (long *)(*(long *)(pEVar2 + 0x10) + 0x70);
      if (*(long *)(pEVar2 + 0x18) != 0) {
        plVar9 = (long *)(*(long *)(pEVar2 + 0x18) + 0x60);
      }
      SimpleItoa_abi_cxx11_
                (&local_70,(protobuf *)(((long)pEVar2 - *plVar9) / 0x38 & 0xffffffff),
                 (int)(((long)pEVar2 - *plVar9) % 0x38));
      io::Printer::Print(pPVar13,"  return $parent$.$descriptor$.getEnumTypes().get($index$);\n",
                         "parent",(string *)&vars,"descriptor",&local_90,"index",&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&vars);
    io::Printer::Print(pPVar13,"}\n\nprivate static final $classname$[] VALUES = ","classname",
                       *(string **)this_00->descriptor_);
    bVar5 = CanUseEnumValues(this_00);
    if (bVar5) {
      pcVar11 = "values();\n";
    }
    else {
      io::Printer::Print(pPVar13,"{\n  ");
      lVar7 = 0;
      pcVar11 = "\n};\n";
      for (lVar14 = 0; pPVar13 = local_d0, lVar14 < *(int *)(this_00->descriptor_ + 0x2c);
          lVar14 = lVar14 + 1) {
        io::Printer::Print(local_d0,"$name$, ","name",
                           *(string **)(*(long *)(this_00->descriptor_ + 0x30) + lVar7));
        lVar7 = lVar7 + 0x28;
      }
    }
    io::Printer::Print(pPVar13,pcVar11);
    io::Printer::Print(pPVar13,
                       "\npublic static $classname$ valueOf(\n    com.google.protobuf.Descriptors.EnumValueDescriptor desc) {\n  if (desc.getType() != getDescriptor()) {\n    throw new java.lang.IllegalArgumentException(\n      \"EnumValueDescriptor is not for this type.\");\n  }\n"
                       ,"classname",*(string **)this_00->descriptor_);
    if (*(int *)(*(long *)(this_00->descriptor_ + 0x10) + 0x8c) == 3) {
      io::Printer::Print(pPVar13,"  if (desc.getIndex() == -1) {\n    return UNRECOGNIZED;\n  }\n");
    }
    io::Printer::Print(pPVar13,"  return VALUES[desc.getIndex()];\n}\n\n");
    if (!bVar1) {
      io::Printer::Print(pPVar13,"private final int index;\n");
    }
  }
  io::Printer::Print(pPVar13,"private final int value;\n\n");
  pcVar11 = "private $classname$(int index, int value) {\n";
  if (bVar1) {
    pcVar11 = "private $classname$(int value) {\n";
  }
  io::Printer::Print(pPVar13,pcVar11,"classname",*(string **)this_00->descriptor_);
  if (((this_00->context_->options_).enforce_lite == false) &&
     (!bVar1 && *(int *)(*(long *)(*(long *)(this_00->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
    io::Printer::Print(pPVar13,"  this.index = index;\n");
  }
  io::Printer::Print(pPVar13,"  this.value = value;\n}\n");
  io::Printer::Print(pPVar13,"\n// @@protoc_insertion_point(enum_scope:$full_name$)\n","full_name",
                     *(string **)(this_00->descriptor_ + 8));
  io::Printer::Outdent(pPVar13);
  io::Printer::Print(pPVar13,"}\n\n");
  std::__cxx11::string::~string((string *)&index_text);
  return;
}

Assistant:

void EnumGenerator::Generate(io::Printer* printer) {
  WriteEnumDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_, immutable_api_);
  printer->Print(
      "public enum $classname$\n"
      "    implements com.google.protobuf.ProtocolMessageEnum {\n",
      "classname", descriptor_->name());
  printer->Annotate("classname", descriptor_);
  printer->Indent();

  bool ordinal_is_index = true;
  string index_text = "ordinal()";
  for (int i = 0; i < canonical_values_.size(); i++) {
    if (canonical_values_[i]->index() != i) {
      ordinal_is_index = false;
      index_text = "index";
      break;
    }
  }

  for (int i = 0; i < canonical_values_.size(); i++) {
    std::map<string, string> vars;
    vars["name"] = canonical_values_[i]->name();
    vars["index"] = SimpleItoa(canonical_values_[i]->index());
    vars["number"] = SimpleItoa(canonical_values_[i]->number());
    WriteEnumValueDocComment(printer, canonical_values_[i]);
    if (canonical_values_[i]->options().deprecated()) {
      printer->Print("@java.lang.Deprecated\n");
    }
    if (ordinal_is_index) {
      printer->Print(vars,
        "$name$($number$),\n");
    } else {
      printer->Print(vars,
        "$name$($index$, $number$),\n");
    }
  }

  if (SupportUnknownEnumValue(descriptor_->file())) {
    if (ordinal_is_index) {
      printer->Print("UNRECOGNIZED(-1),\n");
    } else {
      printer->Print("UNRECOGNIZED(-1, -1),\n");
    }
  }

  printer->Print(
    ";\n"
    "\n");

  // -----------------------------------------------------------------

  for (int i = 0; i < aliases_.size(); i++) {
    std::map<string, string> vars;
    vars["classname"] = descriptor_->name();
    vars["name"] = aliases_[i].value->name();
    vars["canonical_name"] = aliases_[i].canonical_value->name();
    WriteEnumValueDocComment(printer, aliases_[i].value);
    printer->Print(vars,
      "public static final $classname$ $name$ = $canonical_name$;\n");
  }

  for (int i = 0; i < descriptor_->value_count(); i++) {
    std::map<string, string> vars;
    vars["name"] = descriptor_->value(i)->name();
    vars["number"] = SimpleItoa(descriptor_->value(i)->number());
    WriteEnumValueDocComment(printer, descriptor_->value(i));
    printer->Print(vars,
      "public static final int $name$_VALUE = $number$;\n");
  }
  printer->Print("\n");

  // -----------------------------------------------------------------

  printer->Print(
    "\n"
    "public final int getNumber() {\n");
  if (SupportUnknownEnumValue(descriptor_->file())) {
    if (ordinal_is_index) {
      printer->Print(
        "  if (this == UNRECOGNIZED) {\n"
        "    throw new java.lang.IllegalArgumentException(\n"
        "        \"Can't get the number of an unknown enum value.\");\n"
        "  }\n");
    } else {
      printer->Print(
        "  if (index == -1) {\n"
        "    throw new java.lang.IllegalArgumentException(\n"
        "        \"Can't get the number of an unknown enum value.\");\n"
        "  }\n");
    }
  }
  printer->Print(
    "  return value;\n"
    "}\n"
    "\n"
    "/**\n"
    " * @deprecated Use {@link #forNumber(int)} instead.\n"
    " */\n"
    "@java.lang.Deprecated\n"
    "public static $classname$ valueOf(int value) {\n"
    "  return forNumber(value);\n"
    "}\n"
    "\n"
    "public static $classname$ forNumber(int value) {\n"
    "  switch (value) {\n",
    "classname", descriptor_->name());
  printer->Indent();
  printer->Indent();

  for (int i = 0; i < canonical_values_.size(); i++) {
    printer->Print(
      "case $number$: return $name$;\n",
      "name", canonical_values_[i]->name(),
      "number", SimpleItoa(canonical_values_[i]->number()));
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
    "    default: return null;\n"
    "  }\n"
    "}\n"
    "\n"
    "public static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n"
    "    internalGetValueMap() {\n"
    "  return internalValueMap;\n"
    "}\n"
    "private static final com.google.protobuf.Internal.EnumLiteMap<\n"
    "    $classname$> internalValueMap =\n"
    "      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n"
    "        public $classname$ findValueByNumber(int number) {\n"
    "          return $classname$.forNumber(number);\n"
    "        }\n"
    "      };\n"
    "\n",
    "classname", descriptor_->name());

  // -----------------------------------------------------------------
  // Reflection

  if (HasDescriptorMethods(descriptor_, context_->EnforceLite())) {
    printer->Print(
      "public final com.google.protobuf.Descriptors.EnumValueDescriptor\n"
      "    getValueDescriptor() {\n"
      "  return getDescriptor().getValues().get($index_text$);\n"
      "}\n"
      "public final com.google.protobuf.Descriptors.EnumDescriptor\n"
      "    getDescriptorForType() {\n"
      "  return getDescriptor();\n"
      "}\n"
      "public static final com.google.protobuf.Descriptors.EnumDescriptor\n"
      "    getDescriptor() {\n",
      "index_text", index_text);

    // TODO(kenton):  Cache statically?  Note that we can't access descriptors
    //   at module init time because it wouldn't work with descriptor.proto, but
    //   we can cache the value the first time getDescriptor() is called.
    if (descriptor_->containing_type() == NULL) {
      // The class generated for the File fully populates the descriptor with
      // extensions in both the mutable and immutable cases. (In the mutable api
      // this is accomplished by attempting to load the immutable outer class).
      printer->Print(
        "  return $file$.getDescriptor().getEnumTypes().get($index$);\n",
        "file", name_resolver_->GetClassName(descriptor_->file(),
                                             immutable_api_),
        "index", SimpleItoa(descriptor_->index()));
    } else {
      printer->Print(
          "  return $parent$.$descriptor$.getEnumTypes().get($index$);\n",
          "parent", name_resolver_->GetClassName(descriptor_->containing_type(),
                                                 immutable_api_),
          "descriptor", descriptor_->containing_type()->options()
                        .no_standard_descriptor_accessor()
                        ? "getDefaultInstance().getDescriptorForType()"
                        : "getDescriptor()",
          "index", SimpleItoa(descriptor_->index()));
    }

    printer->Print(
      "}\n"
      "\n"
      "private static final $classname$[] VALUES = ",
      "classname", descriptor_->name());

    if (CanUseEnumValues()) {
      // If the constants we are going to output are exactly the ones we
      // have declared in the Java enum in the same order, then we can use
      // the values() method that the Java compiler automatically generates
      // for every enum.
      printer->Print("values();\n");
    } else {
      printer->Print(
        "{\n"
        "  ");
      for (int i = 0; i < descriptor_->value_count(); i++) {
        printer->Print("$name$, ",
          "name", descriptor_->value(i)->name());
      }
      printer->Print(
          "\n"
          "};\n");
    }

    printer->Print(
      "\n"
      "public static $classname$ valueOf(\n"
      "    com.google.protobuf.Descriptors.EnumValueDescriptor desc) {\n"
      "  if (desc.getType() != getDescriptor()) {\n"
      "    throw new java.lang.IllegalArgumentException(\n"
      "      \"EnumValueDescriptor is not for this type.\");\n"
      "  }\n",
      "classname", descriptor_->name());
    if (SupportUnknownEnumValue(descriptor_->file())) {
      printer->Print(
        "  if (desc.getIndex() == -1) {\n"
        "    return UNRECOGNIZED;\n"
        "  }\n");
    }
    printer->Print(
      "  return VALUES[desc.getIndex()];\n"
      "}\n"
      "\n");

    if (!ordinal_is_index) {
      printer->Print("private final int index;\n");
    }
  }

  // -----------------------------------------------------------------

  printer->Print(
    "private final int value;\n\n");

  if (ordinal_is_index) {
    printer->Print(
      "private $classname$(int value) {\n",
      "classname", descriptor_->name());
  } else {
    printer->Print(
      "private $classname$(int index, int value) {\n",
      "classname", descriptor_->name());
  }
  if (HasDescriptorMethods(descriptor_, context_->EnforceLite()) &&
      !ordinal_is_index) {
    printer->Print("  this.index = index;\n");
  }
  printer->Print(
    "  this.value = value;\n"
    "}\n");

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(enum_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}